

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

bool QCoreApplication::notifyInternal2(QObject *receiver,QEvent *event)

{
  char cVar1;
  QObject *pQVar2;
  bool bVar3;
  undefined1 uVar4;
  long in_FS_OFFSET;
  bool result;
  undefined1 local_49;
  QObject *local_48;
  QEvent *local_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (receiver->d_ptr).d[1].q_ptr;
  cVar1 = *(char *)((long)&pQVar2[8].d_ptr.d + 7);
  if ((cVar1 == '\x01') && (g_self._q_value._M_b._M_p == (__base_type)0x0)) {
    uVar4 = 0;
  }
  else {
    local_38 = &local_49;
    local_49 = 0;
    local_48 = receiver;
    local_40 = event;
    bVar3 = QInternal::activateCallbacks(EventNotifyCallback,&local_48);
    uVar4 = local_49;
    if (!bVar3) {
      *(int *)&pQVar2[8].d_ptr.d = *(int *)&pQVar2[8].d_ptr.d + 1;
      if (cVar1 == '\0') {
        if ((((receiver->d_ptr).d)->field_0x30 & 1) == 0) {
          uVar4 = QCoreApplicationPrivate::notify_helper(receiver,event);
        }
        else {
          uVar4 = 0;
        }
      }
      else {
        uVar4 = (**(code **)(*(long *)g_self._q_value._M_b._M_p + 0x60))
                          (g_self._q_value._M_b._M_p,receiver,event);
      }
      *(int *)&pQVar2[8].d_ptr.d = *(int *)&pQVar2[8].d_ptr.d + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)uVar4;
}

Assistant:

bool QCoreApplication::notifyInternal2(QObject *receiver, QEvent *event)
{
    // Qt enforces the rule that events can only be sent to objects in
    // the current thread, so receiver->d_func()->threadData is
    // equivalent to QThreadData::current(), just without the function
    // call overhead.
    QObjectPrivate *d = receiver->d_func();
    QThreadData *threadData = d->threadData.loadAcquire();
    bool selfRequired = threadData->requiresCoreApplication;
    if (selfRequired && !qApp)
        return false;

    // Make it possible for Qt Script to hook into events even
    // though QApplication is subclassed...
    bool result = false;
    void *cbdata[] = { receiver, event, &result };
    if (QInternal::activateCallbacks(QInternal::EventNotifyCallback, cbdata)) {
        return result;
    }

    QScopedScopeLevelCounter scopeLevelCounter(threadData);
    if (!selfRequired)
        return doNotify(receiver, event);

#if QT_VERSION >= QT_VERSION_CHECK(7, 0, 0)
    if (!QThread::isMainThread())
        return false;
#endif
    return qApp->notify(receiver, event);
}